

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O0

bool __thiscall wasm::Literal::isSignedMin(Literal *this)

{
  int iVar1;
  long lVar2;
  BasicType BVar3;
  int iVar4;
  long lVar5;
  Literal *this_local;
  
  BVar3 = wasm::Type::getBasic(&this->type);
  if (BVar3 == i32) {
    iVar1 = (this->field_0).i32;
    iVar4 = std::numeric_limits<int>::min();
    this_local._7_1_ = iVar1 == iVar4;
  }
  else {
    if (BVar3 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                         ,0x95);
    }
    lVar2 = (this->field_0).i64;
    lVar5 = std::numeric_limits<long>::min();
    this_local._7_1_ = lVar2 == lVar5;
  }
  return this_local._7_1_;
}

Assistant:

bool isSignedMin() const {
    switch (type.getBasic()) {
      case Type::i32:
        return i32 == std::numeric_limits<int32_t>::min();
      case Type::i64:
        return i64 == std::numeric_limits<int64_t>::min();
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }